

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O0

void helper_cmpxchg16b_x86_64(CPUX86State *env,target_ulong a0)

{
  undefined1 cmpv_00 [16];
  undefined1 a [16];
  undefined1 a_00 [16];
  undefined1 a_01 [16];
  undefined1 newv_00 [16];
  undefined1 b [16];
  _Bool _Var1;
  uint32_t uVar2;
  uint idx;
  TCGMemOpIdx TVar3;
  Int128 *addr;
  Int128 *retaddr;
  uint64_t uVar4;
  target_ulong tVar5;
  uint64_t hi;
  uint64_t hi_00;
  uintptr_t unaff_retaddr;
  undefined4 in_stack_fffffffffffffefc;
  undefined8 in_stack_ffffffffffffff08;
  undefined8 in_stack_ffffffffffffff10;
  Int128 oldv;
  TCGMemOpIdx oi;
  int mem_idx;
  Int128 newv;
  Int128 cmpv;
  int eflags;
  uintptr_t ra;
  target_ulong a0_local;
  CPUX86State *env_local;
  
  if ((a0 & 0xf) != 0) {
    raise_exception_ra_x86_64(env,0xd,unaff_retaddr);
  }
  uVar2 = cpu_cc_compute_all_x86_64(env,env->cc_op);
  addr = int128_make128((Int128 *)env->regs[0],env->regs[2],hi);
  retaddr = int128_make128((Int128 *)env->regs[3],env->regs[1],hi_00);
  idx = cpu_mmu_index(env,false);
  TVar3 = make_memop_idx(MO_ALIGN_16|MO_64,idx);
  cmpv_00._4_4_ = in_stack_fffffffffffffefc;
  cmpv_00._0_4_ = TVar3;
  cmpv_00._8_8_ = unaff_retaddr;
  newv_00._8_8_ = in_stack_ffffffffffffff10;
  newv_00._0_8_ = in_stack_ffffffffffffff08;
  helper_atomic_cmpxchgo_le_mmu_x86_64
            ((Int128 *)env,(CPUArchState *)a0,(target_ulong)addr,(Int128)cmpv_00,(Int128)newv_00,
             (TCGMemOpIdx)hi_00,(uintptr_t)retaddr);
  a._4_4_ = in_stack_fffffffffffffefc;
  a._0_4_ = TVar3;
  a._8_8_ = unaff_retaddr;
  b._8_8_ = in_stack_ffffffffffffff10;
  b._0_8_ = in_stack_ffffffffffffff08;
  _Var1 = int128_eq((Int128)a,(Int128)b);
  if (_Var1) {
    cmpv._12_4_ = uVar2 | 0x40;
  }
  else {
    a_00._4_4_ = in_stack_fffffffffffffefc;
    a_00._0_4_ = TVar3;
    a_00._8_8_ = unaff_retaddr;
    uVar4 = int128_getlo((Int128)a_00);
    env->regs[0] = uVar4;
    a_01._4_4_ = in_stack_fffffffffffffefc;
    a_01._0_4_ = TVar3;
    a_01._8_8_ = unaff_retaddr;
    tVar5 = int128_gethi((Int128)a_01);
    env->regs[2] = tVar5;
    cmpv._12_4_ = uVar2 & 0xffffffbf;
  }
  env->cc_src = (long)(int)cmpv._12_4_;
  return;
}

Assistant:

void helper_cmpxchg16b(CPUX86State *env, target_ulong a0)
{
    uintptr_t ra = GETPC();

    if ((a0 & 0xf) != 0) {
        raise_exception_ra(env, EXCP0D_GPF, ra);
    } else if (HAVE_CMPXCHG128) {
        int eflags = cpu_cc_compute_all(env, CC_OP);

        Int128 cmpv = int128_make128(env->regs[R_EAX], env->regs[R_EDX]);
        Int128 newv = int128_make128(env->regs[R_EBX], env->regs[R_ECX]);

        int mem_idx = cpu_mmu_index(env, false);
        TCGMemOpIdx oi = make_memop_idx(MO_TEQ | MO_ALIGN_16, mem_idx);
        Int128 oldv = helper_atomic_cmpxchgo_le_mmu(env, a0, cmpv,
                                                    newv, oi, ra);

        if (int128_eq(oldv, cmpv)) {
            eflags |= CC_Z;
        } else {
            env->regs[R_EAX] = int128_getlo(oldv);
            env->regs[R_EDX] = int128_gethi(oldv);
            eflags &= ~CC_Z;
        }
        CC_SRC = eflags;
    } else {
        cpu_loop_exit_atomic(env_cpu(env), ra);
    }
}